

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_32x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  code *pcVar20;
  ulong uVar21;
  uint uVar22;
  int32_t *piVar23;
  uint uVar24;
  int *piVar25;
  long lVar26;
  code *pcVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  int32_t *piVar31;
  __m128i round;
  undefined1 auVar32 [16];
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG local_1078;
  int local_1038 [1026];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x03',&local_1078);
  uVar29 = tx_size_wide[local_1078.tx_size];
  uVar18 = (ulong)uVar29;
  pcVar20 = fdct32_sse4_1;
  pcVar27 = fdct32_sse4_1;
  if (local_1078.txfm_type_col != '\x03') {
    if (local_1078.txfm_type_col == '\v') {
      pcVar27 = idtx32x32_sse4_1;
    }
    else if (local_1078.txfm_type_col == '\x04') {
      pcVar27 = fdct64_new_sse4_1;
    }
    else {
      pcVar27 = (code *)0x0;
    }
  }
  if (local_1078.txfm_type_row != '\x03') {
    if (local_1078.txfm_type_row == '\v') {
      pcVar20 = idtx32x32_sse4_1;
    }
    else if (local_1078.txfm_type_row == '\x04') {
      pcVar20 = fdct64_new_sse4_1;
    }
    else {
      pcVar20 = (code *)0x0;
    }
  }
  piVar25 = local_1038;
  uVar28 = 0;
  do {
    uVar30 = 0;
    do {
      piVar25[uVar30] = (int)input[uVar30];
      uVar30 = uVar30 + 1;
    } while (uVar18 != uVar30);
    uVar28 = uVar28 + 1;
    piVar25 = piVar25 + uVar18;
    input = input + stride;
  } while (uVar28 != uVar18);
  uVar24 = uVar29 * uVar29;
  uVar22 = uVar24 >> 2;
  bVar2 = *local_1078.shift;
  if ((char)bVar2 < '\0') {
    if (3 < uVar24) {
      iVar19 = 1 << (~bVar2 & 0x1f);
      uVar28 = (ulong)uVar22;
      lVar26 = 0;
      auVar32 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        iVar16 = *(int *)((long)local_1038 + lVar26 + 4);
        iVar3 = *(int *)((long)local_1038 + lVar26 + 8);
        iVar4 = *(int *)((long)local_1038 + lVar26 + 0xc);
        piVar25 = (int *)((long)output + lVar26);
        *piVar25 = *(int *)((long)local_1038 + lVar26) + iVar19 >> auVar32;
        piVar25[1] = iVar16 + iVar19 >> auVar32;
        piVar25[2] = iVar3 + iVar19 >> auVar32;
        piVar25[3] = iVar4 + iVar19 >> auVar32;
        lVar26 = lVar26 + 0x10;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
  }
  else if (3 < uVar24) {
    uVar28 = (ulong)uVar22;
    lVar26 = 0;
    do {
      iVar19 = *(int *)((long)local_1038 + lVar26 + 4);
      iVar16 = *(int *)((long)local_1038 + lVar26 + 8);
      iVar3 = *(int *)((long)local_1038 + lVar26 + 0xc);
      piVar25 = (int *)((long)output + lVar26);
      *piVar25 = *(int *)((long)local_1038 + lVar26) << (int)(char)bVar2;
      piVar25[1] = iVar19;
      piVar25[2] = iVar16;
      piVar25[3] = iVar3;
      lVar26 = lVar26 + 0x10;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  (*pcVar27)(output,local_1038,(int)local_1078.cos_bit_col,local_1078.stage_range_col);
  iVar19 = (int)local_1078.shift[1];
  if (iVar19 < 0) {
    if (3 < uVar24) {
      iVar16 = 1 << (~local_1078.shift[1] & 0x1fU);
      uVar28 = (ulong)uVar22;
      lVar26 = 0;
      auVar32 = ZEXT416((uint)-iVar19);
      do {
        iVar19 = *(int *)((long)local_1038 + lVar26 + 4);
        iVar3 = *(int *)((long)local_1038 + lVar26 + 8);
        iVar4 = *(int *)((long)local_1038 + lVar26 + 0xc);
        piVar25 = (int *)((long)output + lVar26);
        *piVar25 = *(int *)((long)local_1038 + lVar26) + iVar16 >> auVar32;
        piVar25[1] = iVar19 + iVar16 >> auVar32;
        piVar25[2] = iVar3 + iVar16 >> auVar32;
        piVar25[3] = iVar4 + iVar16 >> auVar32;
        lVar26 = lVar26 + 0x10;
        uVar28 = uVar28 - 1;
      } while (uVar28 != 0);
    }
  }
  else if (3 < uVar24) {
    uVar28 = (ulong)uVar22;
    lVar26 = 0;
    do {
      iVar16 = *(int *)((long)local_1038 + lVar26 + 4);
      iVar3 = *(int *)((long)local_1038 + lVar26 + 8);
      iVar4 = *(int *)((long)local_1038 + lVar26 + 0xc);
      piVar25 = (int *)((long)output + lVar26);
      *piVar25 = *(int *)((long)local_1038 + lVar26) << iVar19;
      piVar25[1] = iVar16;
      piVar25[2] = iVar3;
      piVar25[3] = iVar4;
      lVar26 = lVar26 + 0x10;
      uVar28 = uVar28 - 1;
    } while (uVar28 != 0);
  }
  uVar17 = uVar29 + 3;
  if (-1 < (int)uVar29) {
    uVar17 = uVar29;
  }
  uVar29 = (int)uVar17 >> 2;
  uVar28 = (ulong)uVar29;
  uVar30 = 0;
  piVar31 = output;
  do {
    iVar19 = 0;
    uVar21 = uVar28;
    piVar23 = piVar31;
    do {
      lVar26 = (long)iVar19;
      iVar16 = piVar23[1];
      iVar5 = piVar23[2];
      iVar3 = piVar23[3];
      piVar25 = piVar23 + uVar28 * 8;
      iVar4 = *piVar25;
      iVar6 = piVar25[1];
      iVar7 = piVar25[2];
      iVar8 = piVar25[3];
      piVar1 = piVar23 + uVar28 * 4;
      iVar9 = piVar1[1];
      iVar10 = piVar1[2];
      iVar11 = piVar1[3];
      piVar25 = piVar23 + uVar28 * 0xc;
      iVar12 = *piVar25;
      iVar13 = piVar25[1];
      iVar14 = piVar25[2];
      iVar15 = piVar25[3];
      piVar25 = local_1038 + uVar30 + lVar26 * 4;
      *(ulong *)piVar25 = CONCAT44(*piVar1,*piVar23);
      piVar25[4] = iVar4;
      piVar25[5] = iVar12;
      piVar25 = local_1038 + uVar30 + lVar26 * 4 + uVar28 * 4;
      *piVar25 = iVar16;
      piVar25[1] = iVar9;
      piVar25[2] = iVar6;
      piVar25[3] = iVar13;
      piVar25 = local_1038 + uVar30 + lVar26 * 4 + (ulong)(uVar29 * 2) * 4;
      *(ulong *)piVar25 = CONCAT44(iVar10,iVar5);
      piVar25[4] = iVar7;
      piVar25[5] = iVar14;
      piVar25 = local_1038 + uVar30 + lVar26 * 4 + (ulong)(uVar29 * 3) * 4;
      *piVar25 = iVar3;
      piVar25[1] = iVar11;
      piVar25[2] = iVar8;
      piVar25[3] = iVar15;
      iVar19 = iVar19 + (uVar17 & 0xfffffffc);
      piVar23 = piVar23 + 4;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
    uVar30 = uVar30 + 4;
    piVar31 = piVar31 + uVar28 * 0x10;
  } while (uVar30 < uVar18);
  (*pcVar20)(local_1038,output,(int)local_1078.cos_bit_row,local_1078.stage_range_row);
  bVar2 = local_1078.shift[2];
  if ((char)bVar2 < '\0') {
    if (3 < uVar24) {
      iVar19 = 1 << (~bVar2 & 0x1f);
      uVar18 = (ulong)uVar22;
      auVar32 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        *output = *output + iVar19 >> auVar32;
        output[1] = output[1] + iVar19 >> auVar32;
        output[2] = output[2] + iVar19 >> auVar32;
        output[3] = output[3] + iVar19 >> auVar32;
        output = output + 4;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
  }
  else if (3 < uVar24) {
    uVar18 = (ulong)uVar22;
    do {
      *output = *output << (int)(char)bVar2;
      output[1] = output[1];
      output[2] = output[2];
      output[3] = output[3];
      output = output + 4;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[1024]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X32, &cfg);
  (void)bd;
  fwd_txfm2d_sse4_1(input, output, stride, &cfg, txfm_buf);
}